

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.hpp
# Opt level: O0

void __thiscall boost::deflate::deflate_stream::deflate_stream(deflate_stream *this)

{
  deflate_stream *this_local;
  
  detail::deflate_stream::deflate_stream(&this->super_deflate_stream);
  reset(this,6,0xf,9,normal,none);
  return;
}

Assistant:

deflate_stream()
    {
        reset(6, 15, default_mem_level, Strategy::normal,boost::deflate::wrap::none);
    }